

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
BasicBlock::RemoveSucc
          (BasicBlock *this,BasicBlock *block,FlowGraph *graph,bool doCleanPred,bool moveToDead)

{
  code *pcVar1;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  Type *ppFVar4;
  BasicBlock *pBVar5;
  undefined4 *puVar6;
  Loop *loop;
  FlowEdge **edge;
  EditingIterator iter;
  bool moveToDead_local;
  bool doCleanPred_local;
  FlowGraph *graph_local;
  BasicBlock *block_local;
  BasicBlock *this_local;
  
  iter.last._6_1_ = moveToDead;
  iter.last._7_1_ = doCleanPred;
  pSVar3 = &GetSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&edge,pSVar3);
  do {
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)&edge);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc9d,"((0))","Edge not found.");
      if (bVar2) {
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&edge);
    pBVar5 = FlowEdge::GetSucc(*ppFVar4);
  } while (pBVar5 != block);
  if ((iter.last._6_1_ & 1) == 0) {
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)&edge,&graph->alloc->super_ArenaAllocator);
  }
  else {
    pSVar3 = &GetDeadSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::MoveCurrentTo
              ((EditingIterator *)&edge,pSVar3);
  }
  if ((iter.last._7_1_ & 1) != 0) {
    RemovePred(block,this,graph,false,(bool)(iter.last._6_1_ & 1));
  }
  if (((*(ushort *)&block->field_0x18 >> 2 & 1) != 0) && (block->loop != (Loop *)0x0)) {
    pSVar3 = &GetPredList(block)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar3);
    if (bVar2) {
      *(ushort *)&block->loop->field_0x178 = *(ushort *)&block->loop->field_0x178 & 0xfffe | 1;
    }
  }
  return;
}

Assistant:

void
BasicBlock::RemoveSucc(BasicBlock *block, FlowGraph * graph, bool doCleanPred, bool moveToDead)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetSuccList(), iter)
    {
        if (edge->GetSucc() == block)
        {
            if (moveToDead)
            {
                iter.MoveCurrentTo(this->GetDeadSuccList());
            }
            else
            {
                iter.RemoveCurrent(graph->alloc);
            }

            if (doCleanPred)
            {
                block->RemovePred(this, graph, false, moveToDead);
            }

            if (block->isLoopHeader && block->loop && block->GetPredList()->HasOne())
            {
                Loop *loop = block->loop;
                loop->isDead = true;
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}